

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pipe2_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_pipe_t *handle;
  uv_loop_t *puVar3;
  pinger_t *pinger;
  undefined8 uVar4;
  char *__format;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t fds [2];
  
  iVar1 = uv_pipe(fds,0x40,0x40);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_guess_handle(fds[0]);
    eval_a = (int64_t)uVar2;
    eval_b = 7;
    if (eval_a == 7) {
      uVar2 = uv_guess_handle(fds[1]);
      eval_a = (int64_t)uVar2;
      eval_b = 7;
      if (eval_a == 7) {
        handle = (uv_pipe_t *)malloc(0xe8);
        if (handle == (uv_pipe_t *)0x0) {
          pcVar5 = "ponger";
          uVar4 = 0x165;
LAB_0015a780:
          eval_b = 0;
          pcVar8 = "!=";
          eval_a = 0;
          pcVar7 = "NULL";
          pcVar6 = "!=";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          goto LAB_0015a82e;
        }
        puVar3 = uv_default_loop();
        iVar1 = uv_pipe_init(puVar3,handle,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_pipe_open(handle,fds[0]);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            pinger = (pinger_t *)malloc(0x168);
            if (pinger == (pinger_t *)0x0) {
              pcVar5 = "pinger";
              uVar4 = 0x16a;
              goto LAB_0015a780;
            }
            pinger->vectored_writes = vectored_writes;
            pinger->pongs = 0;
            pinger->state = 0;
            pinger->pong = PING;
            puVar3 = uv_default_loop();
            iVar1 = uv_pipe_init(puVar3,&(pinger->stream).pipe,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = uv_pipe_open(&(pinger->stream).pipe,fds[1]);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                (pinger->stream).tcp.data = pinger;
                handle->data = pinger;
                pinger_write_ping(pinger);
                iVar1 = uv_read_start((uv_stream_t *)handle,alloc_cb,pinger_read_cb);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  return;
                }
                pcVar7 = "0";
                pcVar5 = "uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb)";
                uVar4 = 0x176;
              }
              else {
                pcVar7 = "0";
                pcVar5 = "uv_pipe_open(&pinger->stream.pipe, fds[1])";
                uVar4 = 0x170;
              }
            }
            else {
              pcVar7 = "0";
              pcVar5 = "uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0)";
              uVar4 = 0x16f;
            }
          }
          else {
            pcVar7 = "0";
            pcVar5 = "uv_pipe_open(ponger, fds[0])";
            uVar4 = 0x167;
          }
        }
        else {
          pcVar7 = "0";
          pcVar5 = "uv_pipe_init(uv_default_loop(), ponger, 0)";
          uVar4 = 0x166;
        }
      }
      else {
        pcVar7 = "UV_NAMED_PIPE";
        pcVar5 = "uv_guess_handle(fds[1])";
        uVar4 = 0x162;
      }
    }
    else {
      pcVar7 = "UV_NAMED_PIPE";
      pcVar5 = "uv_guess_handle(fds[0])";
      uVar4 = 0x161;
    }
  }
  else {
    pcVar7 = "0";
    pcVar5 = "uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE)";
    uVar4 = 0x160;
  }
  pcVar6 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar8 = "==";
LAB_0015a82e:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar4,pcVar5,pcVar6,pcVar7,eval_a,pcVar8,eval_b);
  abort();
}

Assistant:

static void pipe2_pinger_new(int vectored_writes) {
  uv_os_fd_t fds[2];
  pinger_t* pinger;
  uv_pipe_t* ponger;

  /* Try to make a pipe and do NUM_PINGS pings. */
  ASSERT_OK(uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
  ASSERT_EQ(uv_guess_handle(fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle(fds[1]), UV_NAMED_PIPE);

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ASSERT_OK(uv_pipe_init(uv_default_loop(), ponger, 0));
  ASSERT_OK(uv_pipe_open(ponger, fds[0]));

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0));
  ASSERT_OK(uv_pipe_open(&pinger->stream.pipe, fds[1]));
  pinger->stream.pipe.data = pinger; /* record for close_cb */
  ponger->data = pinger; /* record for read_cb */

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb));
}